

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pipeline_private.hh
# Opt level: O0

void __thiscall qpdf::pl::Count::finish(Count *this)

{
  Pipeline *pPVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Count *this_local;
  
  pPVar1 = Pipeline::next(&this->super_Pipeline);
  if (pPVar1 != (Pipeline *)0x0) {
    if ((this->pass_immediately_to_next & 1U) == 0) {
      pPVar1 = Pipeline::next(&this->super_Pipeline);
      uVar2 = std::__cxx11::string::data();
      uVar3 = std::__cxx11::string::size();
      (*pPVar1->_vptr_Pipeline[2])(pPVar1,uVar2,uVar3);
    }
    pPVar1 = Pipeline::next(&this->super_Pipeline);
    (*pPVar1->_vptr_Pipeline[3])();
  }
  return;
}

Assistant:

void
        finish() final
        {
            if (next()) {
                if (!pass_immediately_to_next) {
                    next()->write(reinterpret_cast<unsigned char const*>(str->data()), str->size());
                }
                next()->finish();
            }
        }